

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ChStreamOutAscii *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar3;
  char *pcVar4;
  ChException *myex;
  ChArchiveInXML marchivein_2;
  ChStreamInAsciiFile mfilei_2;
  undefined1 local_1c70 [8];
  string xmlfile_1;
  ChArchiveOutXML marchiveout_3;
  ChStreamOutAsciiFile mfileo_3;
  undefined1 local_17b0 [8];
  string xmlfile;
  ChArchiveInJSON marchivein_1;
  ChStreamInAsciiFile mfilei_1;
  undefined1 local_1208 [8];
  string jsonfile_1;
  ChArchiveOutJSON marchiveout_2;
  ChStreamOutAsciiFile mfileo_2;
  undefined1 local_d48 [8];
  string jsonfile;
  ChArchiveInBinary marchivein;
  ChStreamInBinaryFile mfilei;
  ChStreamInBinary local_918 [48];
  undefined1 local_8e8 [8];
  string binfile_1;
  ChArchiveOutBinary marchiveout_1;
  ChStreamOutBinaryFile mfileo_1;
  ChStreamOutBinary local_4e8 [48];
  undefined1 local_4b8 [8];
  string binfile;
  ChArchiveAsciiDump marchiveout;
  ChStreamOutAsciiFile mfileo;
  ChStreamOutAscii local_b0 [32];
  undefined1 local_90 [8];
  string asciifile;
  path local_60;
  undefined1 local_38 [8];
  string out_dir;
  char **argv_local;
  int argc_local;
  
  out_dir.field_2._8_8_ = argv;
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar2,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"CHRONO foundation classes demo: archives (serialization)\n\n");
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__lhs
                 ,"DEMO_ARCHIVE");
  filesystem::path::path
            (&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
            );
  bVar1 = filesystem::create_directory(&local_60);
  filesystem::path::~path(&local_60);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error creating directory ");
    poVar3 = std::operator<<(poVar3,(string *)local_38);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.txt");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)&marchiveout.suppress_names,pcVar4,_S_trunc);
    chrono::ChArchiveAsciiDump::ChArchiveAsciiDump
              ((ChArchiveAsciiDump *)((long)&binfile.field_2 + 8),local_b0);
    my_serialization_example((ChArchiveOut *)((long)&binfile.field_2 + 8));
    chrono::ChArchiveAsciiDump::~ChArchiveAsciiDump
              ((ChArchiveAsciiDump *)((long)&binfile.field_2 + 8));
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)&marchiveout.suppress_names);
    std::__cxx11::string::~string((string *)local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.dat");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamOutBinaryFile::ChStreamOutBinaryFile
              ((ChStreamOutBinaryFile *)&marchiveout_1.ostream,pcVar4,_S_trunc);
    chrono::ChArchiveOutBinary::ChArchiveOutBinary
              ((ChArchiveOutBinary *)((long)&binfile_1.field_2 + 8),local_4e8);
    my_serialization_example((ChArchiveOut *)((long)&binfile_1.field_2 + 8));
    chrono::ChArchiveOutBinary::~ChArchiveOutBinary
              ((ChArchiveOutBinary *)((long)&binfile_1.field_2 + 8));
    chrono::ChStreamOutBinaryFile::~ChStreamOutBinaryFile
              ((ChStreamOutBinaryFile *)&marchiveout_1.ostream);
    std::__cxx11::string::~string((string *)local_4b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.dat");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamInBinaryFile::ChStreamInBinaryFile
              ((ChStreamInBinaryFile *)&marchivein.istream,pcVar4);
    chrono::ChArchiveInBinary::ChArchiveInBinary
              ((ChArchiveInBinary *)((long)&jsonfile.field_2 + 8),local_918);
    my_deserialization_example((ChArchiveIn *)((long)&jsonfile.field_2 + 8));
    chrono::ChArchiveInBinary::~ChArchiveInBinary
              ((ChArchiveInBinary *)((long)&jsonfile.field_2 + 8));
    chrono::ChStreamInBinaryFile::~ChStreamInBinaryFile((ChStreamInBinaryFile *)&marchivein.istream)
    ;
    std::__cxx11::string::~string((string *)local_8e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.json");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)
               ((long)&marchiveout_2.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18),pcVar4,_S_trunc);
    chrono::ChArchiveOutJSON::ChArchiveOutJSON
              ((ChArchiveOutJSON *)((long)&jsonfile_1.field_2 + 8),
               (ChStreamOutAsciiFile *)
               ((long)&marchiveout_2.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18));
    my_serialization_example((ChArchiveOut *)((long)&jsonfile_1.field_2 + 8));
    chrono::ChArchiveOutJSON::~ChArchiveOutJSON((ChArchiveOutJSON *)((long)&jsonfile_1.field_2 + 8))
    ;
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)
               ((long)&marchiveout_2.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18));
    std::__cxx11::string::~string((string *)local_d48);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.json");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)&marchivein_1.tolerate_missing_tokens,pcVar4);
    chrono::ChArchiveInJSON::ChArchiveInJSON
              ((ChArchiveInJSON *)((long)&xmlfile.field_2 + 8),
               (ChStreamInAsciiFile *)&marchivein_1.tolerate_missing_tokens);
    my_deserialization_example((ChArchiveIn *)((long)&xmlfile.field_2 + 8));
    chrono::ChArchiveInJSON::~ChArchiveInJSON((ChArchiveInJSON *)((long)&xmlfile.field_2 + 8));
    chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)&marchivein_1.tolerate_missing_tokens);
    std::__cxx11::string::~string((string *)local_1208);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.xml");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)
               ((long)&marchiveout_3.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18),pcVar4,_S_trunc);
    chrono::ChArchiveOutXML::ChArchiveOutXML
              ((ChArchiveOutXML *)((long)&xmlfile_1.field_2 + 8),
               (ChStreamOutAsciiFile *)
               ((long)&marchiveout_3.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18));
    my_serialization_example((ChArchiveOut *)((long)&xmlfile_1.field_2 + 8));
    chrono::ChArchiveOutXML::~ChArchiveOutXML((ChArchiveOutXML *)((long)&xmlfile_1.field_2 + 8));
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile
              ((ChStreamOutAsciiFile *)
               ((long)&marchiveout_3.is_array.c.super__Deque_base<bool,_std::allocator<bool>_>.
                       _M_impl.super__Deque_impl_data._M_finish + 0x18));
    std::__cxx11::string::~string((string *)local_17b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/foo_archive.xml");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)
               &marchivein_2.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10,pcVar4);
    chrono::ChArchiveInXML::ChArchiveInXML
              ((ChArchiveInXML *)&myex,
               (ChStreamInAsciiFile *)
               &marchivein_2.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10);
    my_deserialization_example((ChArchiveIn *)&myex);
    chrono::ChArchiveInXML::~ChArchiveInXML((ChArchiveInXML *)&myex);
    chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)
               &marchivein_2.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10);
    std::__cxx11::string::~string((string *)local_1c70);
    pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar2,"Serialization test ended with success.\n\n");
    my_reflection_example();
    pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar2,"Reflection test ended with success.\n");
  }
  argv_local._4_4_ = (uint)bVar1;
  asciifile.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    GetLog() << "CHRONO foundation classes demo: archives (serialization)\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_ARCHIVE";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //  Archives inherited from the base class ChArchiveOut can be
    // used to serialize objects, and streams inherited from ChArchiveIn
    // can be used to get them back. For example, file streams like
    // ChArchiveOutBinary and ChArchiveInBinary can be used for this
    // purpose.
    
    try {       
        
		
        {
            //
            // Example: SERIALIZE TO ASCII DUMP (useful for debugging etc.):
            //

            std::string asciifile = out_dir + "/foo_archive.txt";
            ChStreamOutAsciiFile mfileo(asciifile.c_str());

            // Create an ASCII archive object, for dumping C++ objects into a readable file
            ChArchiveAsciiDump marchiveout(mfileo);
        
            my_serialization_example(marchiveout);
        }


        {
            //
            // Example: SERIALIZE TO/FROM BINARY:
            //

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamOutBinaryFile mfileo(binfile.c_str());
                
				// Use a binary archive object to serialize C++ objects into the binary file
                ChArchiveOutBinary marchiveout(mfileo);

                my_serialization_example(marchiveout);
            }

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamInBinaryFile mfilei(binfile.c_str());
                
				// Use a binary archive object to deserialize C++ objects from the binary file
                ChArchiveInBinary marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
        }


        {
            //
            // Example: SERIALIZE TO/FROM JSON:
            //

            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamOutAsciiFile mfileo(jsonfile.c_str());

                // Use a JSON archive object to serialize C++ objects into the file
                ChArchiveOutJSON marchiveout(mfileo);
        
                my_serialization_example(marchiveout);
            }

            
            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamInAsciiFile mfilei(jsonfile.c_str());

				// Use a JSON archive object to deserialize C++ objects from the file
                ChArchiveInJSON marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
            
        }


		{
			//
			// Example: SERIALIZE TO/FROM XML
			//
			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamOutAsciiFile mfileo(xmlfile.c_str());

				// Use a XML archive object to serialize C++ objects into the file
				ChArchiveOutXML marchiveout(mfileo);

				my_serialization_example(marchiveout);
			}

			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamInAsciiFile mfilei(xmlfile.c_str());

				// Use a XML archive object to deserialize C++ objects from the file
				ChArchiveInXML marchivein(mfilei);

				my_deserialization_example(marchivein);
			}

		}


        GetLog() << "Serialization test ended with success.\n\n";


        my_reflection_example();

        GetLog() << "Reflection test ended with success.\n";


		

    } catch (const ChException &myex) {
        GetLog() << "ERROR: " << myex.what() << "\n\n";
    }


    return 0;
}